

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uscript_props.cpp
# Opt level: O0

UnicodeString *
uscript_getSampleUnicodeString_63(UnicodeString *__return_storage_ptr__,UScriptCode script)

{
  uint uVar1;
  int32_t sampleChar;
  UScriptCode script_local;
  UnicodeString *sample;
  
  icu_63::UnicodeString::UnicodeString(__return_storage_ptr__);
  uVar1 = anon_unknown.dwarf_dac3c::getScriptProps(script);
  if ((uVar1 & 0x1fffff) != 0) {
    icu_63::UnicodeString::append(__return_storage_ptr__,uVar1 & 0x1fffff);
  }
  return __return_storage_ptr__;
}

Assistant:

U_COMMON_API icu::UnicodeString U_EXPORT2
uscript_getSampleUnicodeString(UScriptCode script) {
    icu::UnicodeString sample;
    int32_t sampleChar = getScriptProps(script) & 0x1fffff;
    if(sampleChar != 0) {
        sample.append(sampleChar);
    }
    return sample;
}